

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenUnary(BinaryenModuleRef module,BinaryenOp op,BinaryenExpressionRef value)

{
  Unary *pUVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pUVar1 = wasm::Builder::makeUnary(&local_10,op,value);
  return (BinaryenExpressionRef)pUVar1;
}

Assistant:

BinaryenExpressionRef BinaryenUnary(BinaryenModuleRef module,
                                    BinaryenOp op,
                                    BinaryenExpressionRef value) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeUnary(UnaryOp(op), (Expression*)value));
}